

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O1

vector_t * __thiscall
cfg::tag_vector_t<cfgfile::qstring_trait_t>::get_cfg
          (vector_t *__return_storage_ptr__,tag_vector_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  pointer psVar2;
  ulong uVar3;
  long lVar4;
  vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> vector__;
  vector<cfg::tags_t,_std::allocator<cfg::tags_t>_> local_128;
  tags_t local_110;
  
  (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = cfgfile::tag_t<cfgfile::qstring_trait_t>::is_defined
                    (&(this->m_vector).super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar1) {
    local_128.super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar2 = (this->m_vector).m_tags.
             super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vector).m_tags.
        super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        tag_tags_t<cfgfile::qstring_trait_t>::get_cfg
                  (&local_110,
                   *(tag_tags_t<cfgfile::qstring_trait_t> **)
                    ((long)&(psVar2->
                            super___shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + lVar4));
        std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::emplace_back<cfg::tags_t>
                  (&local_128,&local_110);
        tags_t::~tags_t(&local_110);
        uVar3 = uVar3 + 1;
        psVar2 = (this->m_vector).m_tags.
                 super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 < (ulong)((long)(this->m_vector).m_tags.
                                     super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::qstring_trait_t>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4)
              );
    }
    std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::operator=
              (&__return_storage_ptr__->m_vector,&local_128);
    std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::~vector(&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

vector_t get_cfg() const
	{
		vector_t c;

		if( m_vector.is_defined() )
		{
			std::vector< cfg::tags_t > vector__;

			for( std::size_t i = 0; i < m_vector.size(); ++i )
				vector__.push_back( m_vector.at( i ).get_cfg() );

			c.set_vector( vector__ );
		}

		return c;
	}